

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

CScript * script_tests::sign_multisig
                    (CScript *__return_storage_ptr__,CScript *scriptPubKey,
                    vector<CKey,_std::allocator<CKey>_> *keys,CTransaction *transaction)

{
  CScript *pCVar1;
  pointer pCVar2;
  iterator pvVar3;
  lazy_ostream *amount;
  pointer this;
  long in_FS_OFFSET;
  const_string file;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string msg;
  check_type cVar4;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  lazy_ostream local_d0;
  undefined1 *local_c0;
  char **local_b8;
  assertion_result local_b0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  uint256 hash;
  
  pCVar1 = *(CScript **)(in_FS_OFFSET + 0x28);
  amount = &local_d0;
  local_d0._vptr_lazy_ostream = (_func_int **)0x0;
  pvVar3 = (iterator)0x1;
  SignatureHash<CTransaction>
            (&hash,scriptPubKey,transaction,0,1,(CAmount *)amount,BASE,
             (PrecomputedTransactionData *)0x0);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  local_d0._vptr_lazy_ostream =
       (_func_int **)((ulong)local_d0._vptr_lazy_ostream & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&__return_storage_ptr__->super_CScriptBase,(iterator)__return_storage_ptr__,
             (uchar *)&local_d0);
  this = (keys->super__Vector_base<CKey,_std::allocator<CKey>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  pCVar2 = (keys->super__Vector_base<CKey,_std::allocator<CKey>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (this != pCVar2) {
    do {
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_80 = "";
      local_98 = &boost::unit_test::basic_cstring<char_const>::null;
      local_90 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x3fe;
      file.m_begin = (iterator)&local_88;
      msg.m_end = (iterator)amount;
      msg.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
      _cVar4 = 0x5e21c4;
      local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)CKey::Sign(this,&hash,&vchSig,true,0);
      local_b0.m_message.px = (element_type *)0x0;
      local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_e0 = "key.Sign(hash, vchSig)";
      local_d8 = "";
      local_d0.m_empty = false;
      local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
      local_c0 = boost::unit_test::lazy_ostream::inst;
      local_b8 = &local_e0;
      local_f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_e8 = "";
      pvVar3 = (iterator)0x1;
      amount = (lazy_ostream *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_b0,&local_d0,1,0,WARN,_cVar4,(size_t)&local_f0,0x3fe);
      boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
      local_d0._vptr_lazy_ostream = (_func_int **)CONCAT71(local_d0._vptr_lazy_ostream._1_7_,1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&vchSig,(uchar *)&local_d0);
      b._M_extent._M_extent_value =
           (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      b._M_ptr = vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      CScript::operator<<(__return_storage_ptr__,b);
      if (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)vchSig.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vchSig.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      this = this + 1;
    } while (this != pCVar2);
  }
  if (*(CScript **)(in_FS_OFFSET + 0x28) == pCVar1) {
    return *(CScript **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static CScript
sign_multisig(const CScript& scriptPubKey, const std::vector<CKey>& keys, const CTransaction& transaction)
{
    uint256 hash = SignatureHash(scriptPubKey, transaction, 0, SIGHASH_ALL, 0, SigVersion::BASE);

    CScript result;
    //
    // NOTE: CHECKMULTISIG has an unfortunate bug; it requires
    // one extra item on the stack, before the signatures.
    // Putting OP_0 on the stack is the workaround;
    // fixing the bug would mean splitting the block chain (old
    // clients would not accept new CHECKMULTISIG transactions,
    // and vice-versa)
    //
    result << OP_0;
    for (const CKey &key : keys)
    {
        std::vector<unsigned char> vchSig;
        BOOST_CHECK(key.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        result << vchSig;
    }
    return result;
}